

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O1

void __thiscall QUnixPrintWidgetPrivate::setupPrinterProperties(QUnixPrintWidgetPrivate *this)

{
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QPrintPropertiesDialog *this_00;
  QPrinter *printer;
  OutputFormat outputFormat;
  long in_FS_OFFSET;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->propertiesDialog != (QPrintPropertiesDialog *)0x0) {
    (**(code **)(*(long *)this->propertiesDialog + 0x20))();
  }
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  outputFormat = PdfFormat;
  bVar2 = QPrintDialog::testOption((QPrintDialog *)this->q,PrintToFile);
  if (bVar2) {
    iVar3 = QComboBox::currentIndex();
    iVar4 = QComboBox::count();
    if (iVar3 == iVar4 + -1) goto LAB_00146477;
  }
  QComboBox::currentText();
  pDVar1 = local_48.d.d;
  local_48.d.d = (Data *)local_68;
  local_48.d.ptr = pcStack_60;
  local_48.d.size = local_58;
  if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
    }
  }
  outputFormat = NativeFormat;
LAB_00146477:
  this_00 = (QPrintPropertiesDialog *)operator_new(0x88);
  printer = QAbstractPrintDialog::printer((QAbstractPrintDialog *)this->q);
  QPrintPropertiesDialog::QPrintPropertiesDialog
            ((QPrintPropertiesDialog *)this_00,printer,&this->m_currentPrintDevice,outputFormat,
             &local_48,&this->q->super_QAbstractPrintDialog);
  this->propertiesDialog = this_00;
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnixPrintWidgetPrivate::setupPrinterProperties()
{
    delete propertiesDialog;

    QPrinter::OutputFormat outputFormat;
    QString printerName;

    if (q->testOption(QPrintDialog::PrintToFile)
        && (widget.printers->currentIndex() == widget.printers->count() - 1)) {// PDF
        outputFormat = QPrinter::PdfFormat;
    } else {
        outputFormat = QPrinter::NativeFormat;
        printerName = widget.printers->currentText();
    }

    propertiesDialog = new QPrintPropertiesDialog(q->printer(), &m_currentPrintDevice, outputFormat, printerName, q);
}